

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

_Bool SystemZ_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  DecodeStatus DVar1;
  long in_RCX;
  ulong in_RDX;
  byte *in_RSI;
  ushort *in_R8;
  uint16_t I;
  uint8_t *Table;
  uint64_t Inst;
  undefined2 local_4a;
  undefined1 local_1;
  
  if (*in_RSI < 0x40) {
    *in_R8 = 2;
  }
  else if (*in_RSI < 0xc0) {
    *in_R8 = 4;
  }
  else {
    *in_R8 = 6;
  }
  if (in_RDX < *in_R8) {
    local_1 = false;
  }
  else {
    if (*(long *)(*(long *)(in_RCX + 0x310) + 0xf0) != 0) {
      memset(*(void **)(*(long *)(in_RCX + 0x310) + 0xf0),0,0x120);
    }
    for (local_4a = 0; local_4a < *in_R8; local_4a = local_4a + 1) {
    }
    DVar1 = decodeInstruction((uint8_t *)code_len,MI,(uint64_t)size,address,(MCRegisterInfo *)Inst,
                              Table._4_4_);
    local_1 = DVar1 != MCDisassembler_Fail;
  }
  return local_1;
}

Assistant:

bool SystemZ_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint64_t Inst;
	const uint8_t *Table;
	uint16_t I; 

	// The top 2 bits of the first byte specify the size.
	if (*code < 0x40) {
		*size = 2;
		Table = DecoderTable16;
	} else if (*code < 0xc0) {
		*size = 4;
		Table = DecoderTable32;
	} else {
		*size = 6;
		Table = DecoderTable48;
	}

	if (code_len < *size)
		// short of input data
		return false;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, sysz)+sizeof(cs_sysz));
	}

	// Construct the instruction.
	Inst = 0;
	for (I = 0; I < *size; ++I)
		Inst = (Inst << 8) | code[I];

	return decodeInstruction(Table, MI, Inst, address, info, 0);
}